

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.h
# Opt level: O0

char * cinatra::detail::findchar_fast
                 (char *buf,char *buf_end,char *ranges,int ranges_size,int *found)

{
  int *found_local;
  int ranges_size_local;
  char *ranges_local;
  char *buf_end_local;
  char *buf_local;
  
  *found = 0;
  return buf;
}

Assistant:

static const char *findchar_fast(const char *buf, const char *buf_end,
                                 const char *ranges, int ranges_size,
                                 int *found) {
  *found = 0;
#ifdef CINATRA_SSE
  if (likely(buf_end - buf >= 16)) {
    __m128i ranges16 = _mm_loadu_si128((const __m128i *)ranges);

    size_t left = (buf_end - buf) & ~15;
    do {
      __m128i b16 = _mm_loadu_si128((const __m128i *)buf);
      int r = _mm_cmpestri(
          ranges16, ranges_size, b16, 16,
          _SIDD_LEAST_SIGNIFICANT | _SIDD_CMP_RANGES | _SIDD_UBYTE_OPS);
      if (unlikely(r != 16)) {
        buf += r;
        *found = 1;
        break;
      }
      buf += 16;
      left -= 16;
    } while (likely(left != 0));
  }
#else
  /* suppress unused parameter warning */
  (void)buf_end;
  (void)ranges;
  (void)ranges_size;
#endif
  return buf;
}